

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::OutputFile::breakScanLine(OutputFile *this,int y,int offset,int length,char c)

{
  Data *pDVar1;
  unsigned_long uVar2;
  OutputStreamMutex *pOVar3;
  OStream *pOVar4;
  ostream *poVar5;
  char *pcVar6;
  ArgExc *this_00;
  int iVar7;
  bool bVar8;
  char c_local;
  Lock local_1b8;
  stringstream _iex_throw_s;
  ostream local_198 [376];
  
  local_1b8._mutex = &this->_data->_streamData->super_Mutex;
  c_local = c;
  std::mutex::lock(local_1b8._mutex);
  local_1b8._locked = true;
  pDVar1 = this->_data;
  uVar2 = (pDVar1->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[(y - pDVar1->minY) / pDVar1->linesInBuffer];
  if (uVar2 != 0) {
    pOVar3 = pDVar1->_streamData;
    pOVar3->currentPosition = 0;
    pOVar4 = pOVar3->os;
    (*pOVar4->_vptr_OStream[4])(pOVar4,uVar2 + (long)offset);
    iVar7 = 0;
    if (0 < length) {
      iVar7 = length;
    }
    while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
      pOVar4 = this->_data->_streamData->os;
      (*pOVar4->_vptr_OStream[2])(pOVar4,&c_local,1);
    }
    IlmThread_2_5::Lock::~Lock(&local_1b8);
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar5 = std::operator<<(local_198,"Cannot overwrite scan line ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,y);
  poVar5 = std::operator<<(poVar5,". The scan line has not yet been stored in file \"");
  pcVar6 = fileName(this);
  poVar5 = std::operator<<(poVar5,pcVar6);
  std::operator<<(poVar5,"\".");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void	
OutputFile::breakScanLine  (int y, int offset, int length, char c)
{
    Lock lock (*_data->_streamData);

    Int64 position = 
	_data->lineOffsets[(y - _data->minY) / _data->linesInBuffer];

    if (!position)
	THROW (IEX_NAMESPACE::ArgExc, "Cannot overwrite scan line " << y << ". "
			    "The scan line has not yet been stored in "
			    "file \"" << fileName() << "\".");

    _data->_streamData->currentPosition = 0;
    _data->_streamData->os->seekp (position + offset);

    for (int i = 0; i < length; ++i)
        _data->_streamData->os->write (&c, 1);
}